

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O0

void Macro_smpsVcAmpMod(uint arg_count,long *arg_array)

{
  long *arg_array_local;
  uint arg_count_local;
  
  if (3 < arg_count) {
    if (target_smps2asm_version == 0) {
      vcAM1 = (uint)(*arg_array << 5);
      vcAM2 = (uint)(arg_array[1] << 5);
      vcAM3 = (uint)(arg_array[2] << 5);
      vcAM4 = (uint)(arg_array[3] << 5);
    }
    else {
      vcAM1 = (uint)(*arg_array << 7);
      vcAM2 = (uint)(arg_array[1] << 7);
      vcAM3 = (uint)(arg_array[2] << 7);
      vcAM4 = (uint)(arg_array[3] << 7);
    }
    return;
  }
  __assert_fail("arg_count >= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                ,0x50d,"void Macro_smpsVcAmpMod(unsigned int, long *)");
}

Assistant:

static void Macro_smpsVcAmpMod(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 4);

	if (target_smps2asm_version == 0)
	{
		vcAM1 = arg_array[0] << 5;
		vcAM2 = arg_array[1] << 5;
		vcAM3 = arg_array[2] << 5;
		vcAM4 = arg_array[3] << 5;
	}
	else
	{
		vcAM1 = arg_array[0] << 7;
		vcAM2 = arg_array[1] << 7;
		vcAM3 = arg_array[2] << 7;
		vcAM4 = arg_array[3] << 7;
	}
}